

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void xmlCharacters(xmlParserCtxtPtr ctxt,xmlChar *buf,int size,int isBlank)

{
  int iVar1;
  bool bVar2;
  int checkBlanks;
  int isBlank_local;
  int size_local;
  xmlChar *buf_local;
  xmlParserCtxtPtr ctxt_local;
  
  if ((ctxt->sax != (_xmlSAXHandler *)0x0) && (ctxt->disableSAX == 0)) {
    bVar2 = true;
    if (ctxt->keepBlanks != 0) {
      bVar2 = ctxt->sax->ignorableWhitespace != ctxt->sax->characters;
    }
    if ((bVar2) && (iVar1 = areBlanks(ctxt,buf,size,isBlank), iVar1 != 0)) {
      if ((ctxt->sax->ignorableWhitespace != (ignorableWhitespaceSAXFunc)0x0) &&
         (ctxt->keepBlanks != 0)) {
        (*ctxt->sax->ignorableWhitespace)(ctxt->userData,buf,size);
      }
    }
    else {
      if (ctxt->sax->characters != (charactersSAXFunc)0x0) {
        (*ctxt->sax->characters)(ctxt->userData,buf,size);
      }
      if ((bVar2) && (*ctxt->space == -1)) {
        *ctxt->space = -2;
      }
    }
  }
  return;
}

Assistant:

static void
xmlCharacters(xmlParserCtxtPtr ctxt, const xmlChar *buf, int size,
              int isBlank) {
    int checkBlanks;

    if ((ctxt->sax == NULL) || (ctxt->disableSAX))
        return;

    checkBlanks = (!ctxt->keepBlanks) ||
                  (ctxt->sax->ignorableWhitespace != ctxt->sax->characters);

    /*
     * Calling areBlanks with only parts of a text node
     * is fundamentally broken, making the NOBLANKS option
     * essentially unusable.
     */
    if ((checkBlanks) &&
        (areBlanks(ctxt, buf, size, isBlank))) {
        if ((ctxt->sax->ignorableWhitespace != NULL) &&
            (ctxt->keepBlanks))
            ctxt->sax->ignorableWhitespace(ctxt->userData, buf, size);
    } else {
        if (ctxt->sax->characters != NULL)
            ctxt->sax->characters(ctxt->userData, buf, size);

        /*
         * The old code used to update this value for "complex" data
         * even if checkBlanks was false. This was probably a bug.
         */
        if ((checkBlanks) && (*ctxt->space == -1))
            *ctxt->space = -2;
    }
}